

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::udp_tracker_connection::start(udp_tracker_connection *this)

{
  event_t eVar1;
  session_settings *this_00;
  resolver_interface *prVar2;
  bool bVar3;
  uint uVar4;
  int completion_timeout;
  int read_timeout;
  error_code *in_R8;
  string_view url;
  int port;
  string hostname;
  error_code ec;
  string protocol;
  _Function_base local_108;
  undefined1 local_e8 [32];
  time_point local_c8;
  shared_ptr<libtorrent::aux::request_callback> cb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_98 [13];
  
  hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
  hostname._M_string_length = 0;
  protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
  protocol._M_string_length = 0;
  hostname.field_2._M_local_buf[0] = '\0';
  protocol.field_2._M_local_buf[0] = '\0';
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  url._M_str = (char *)&ec;
  url._M_len = (size_t)(this->super_tracker_connection).m_req.url._M_dataplus._M_p;
  parse_url_components_abi_cxx11_
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&cb,(aux *)(this->super_tracker_connection).m_req.url._M_string_length,url,in_R8);
  local_e8._0_8_ = &::std::ignore;
  local_e8._8_8_ = &port;
  local_e8._16_8_ = &hostname;
  local_e8._24_8_ = &::std::ignore;
  local_c8.__d.__r = (duration)&protocol;
  ::std::
  _Tuple_impl<0ul,std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
  ::
  _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            ((_Tuple_impl<0ul,std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
              *)local_e8,
             (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&cb);
  ::std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&cb);
  if (port == -1) {
    bVar3 = ::std::operator==(&protocol,"http");
    port = 0x1bb;
    if (bVar3) {
      port = 0x50;
    }
  }
  if (ec.failed_ == true) {
    tracker_connection::fail
              (&this->super_tracker_connection,&ec,parse_address,"",(seconds32)0x0,(seconds32)0x0);
  }
  else {
    this_00 = ((this->super_tracker_connection).m_man)->m_settings;
    uVar4 = session_settings::get_int(this_00,0x407b);
    bVar3 = session_settings::get_bool(this_00,0x8040);
    if (bVar3 && (uVar4 & 0xfffffffe) == 2) {
      ::std::__cxx11::string::_M_assign((string *)&this->m_hostname);
      (this->m_target).impl_.data_.v4.sin_port = (ushort)port << 8 | (ushort)port >> 8;
      start_announce(this);
    }
    else {
      prVar2 = ((this->super_tracker_connection).m_man)->m_host_resolver;
      eVar1 = (this->super_tracker_connection).m_req.event;
      shared_from_this((udp_tracker_connection *)local_e8);
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)name_lookup;
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      a_Stack_98[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
      local_e8._0_8_ = (_func_int **)0x0;
      local_e8._8_8_ = (element_type *)0x0;
      ::std::
      function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
      ::
      function<std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>,int))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int)>,void>
                ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                  *)&local_108,
                 (_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>
                  *)&cb);
      (**prVar2->_vptr_resolver_interface)
                (prVar2,&hostname,(ulong)(eVar1 == stopped | 2),&local_108);
      ::std::_Function_base::~_Function_base(&local_108);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_98);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
      tracker_connection::requester((tracker_connection *)&cb);
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_request_callback[7])
                  (cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,"*** UDP_TRACKER [ initiating name lookup: \"%s\" ]",
                   hostname._M_dataplus._M_p);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    completion_timeout =
         session_settings::get_int
                   (this_00,(uint)((this->super_tracker_connection).m_req.event == stopped) * 2 +
                            0x4000);
    read_timeout = session_settings::get_int(this_00,0x4001);
    timeout_handler::set_timeout((timeout_handler *)this,completion_timeout,read_timeout);
  }
  ::std::__cxx11::string::~string((string *)&protocol);
  ::std::__cxx11::string::~string((string *)&hostname);
  return;
}

Assistant:

void udp_tracker_connection::start()
	{
		// TODO: 2 support authentication here. tracker_req().auth
		std::string hostname;
		std::string protocol;
		int port;
		error_code ec;

		std::tie(protocol, std::ignore, hostname, port, std::ignore)
			= parse_url_components(tracker_req().url, ec);
		if (port == -1) port = protocol == "http" ? 80 : 443;

		if (ec)
		{
			tracker_connection::fail(ec, operation_t::parse_address);
			return;
		}

		aux::session_settings const& settings = m_man.settings();

		int const proxy_type = settings.get_int(settings_pack::proxy_type);

		if (settings.get_bool(settings_pack::proxy_hostnames)
			&& (proxy_type == settings_pack::socks5
				|| proxy_type == settings_pack::socks5_pw))
		{
			m_hostname = hostname;
			m_target.port(std::uint16_t(port));
			start_announce();
		}
		else
		{
			using namespace std::placeholders;
			ADD_OUTSTANDING_ASYNC("udp_tracker_connection::name_lookup");
			// when stopping, pass in the cache-only flag, because we
			// don't want to get stuck on DNS lookups when shutting down
			m_man.host_resolver().async_resolve(hostname
				, (tracker_req().event == event_t::stopped
					? aux::resolver_interface::cache_only : aux::resolver_flags{})
					| aux::resolver_interface::abort_on_shutdown
				, std::bind(&udp_tracker_connection::name_lookup
					, shared_from_this(), _1, _2, port));

#ifndef TORRENT_DISABLE_LOGGING
			std::shared_ptr<request_callback> cb = requester();
			if (cb) cb->debug_log("*** UDP_TRACKER [ initiating name lookup: \"%s\" ]"
				, hostname.c_str());
#endif
		}

		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}